

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O2

void __thiscall
MetadataMultilayerEncodeTest_Test_Test::MetadataMultilayerEncodeTest_Test_Test
          (MetadataMultilayerEncodeTest_Test_Test *this)

{
  ParamType *pPVar1;
  
  libaom_test::CodecTestWithParam<libaom_test::TestMode>::CodecTestWithParam
            ((CodecTestWithParam<libaom_test::TestMode> *)this);
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>
           ::GetParam();
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.codec_ =
       (pPVar1->super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode>).
       super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.abort_ = false;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.stats_.buffer_._M_dataplus._M_p =
       (pointer)&(this->super_MetadataMultilayerEncodeTest).super_EncoderTest.stats_.buffer_.field_2
  ;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.stats_.buffer_._M_string_length = 0;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.stats_.buffer_.field_2._M_local_buf
  [0] = '\0';
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.init_flags_ = 0;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.frame_flags_ = 0;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.mode_ = kRealTime;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest.cfg_.g_threads = 1;
  *(undefined8 *)&(this->super_MetadataMultilayerEncodeTest).super_EncoderTest.field_0x3dc = 0;
  (this->super_MetadataMultilayerEncodeTest).super_CodecTestWithParam<libaom_test::TestMode>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__MetadataMultilayerEncodeTest_00f548d0;
  (this->super_MetadataMultilayerEncodeTest).super_CodecTestWithParam<libaom_test::TestMode>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__MetadataMultilayerEncodeTest_Test_Test_00f54930;
  (this->super_MetadataMultilayerEncodeTest).super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__MetadataMultilayerEncodeTest_Test_Test_00f54950;
  return;
}

Assistant:

TEST_P(MetadataMultilayerEncodeTest, Test) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 0;
  cfg_.rc_target_bitrate = 1200;

  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, /*limit=*/10);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}